

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_closed_list.hpp
# Opt level: O0

pair<bool,_bool> __thiscall
compress::CompressClosedList<Node<Tiles>_>::find_in_buffers
          (CompressClosedList<Node<Tiles>_> *this,Node<Tiles> *entry)

{
  bool bVar1;
  pair<bool,_bool> pVar2;
  int iVar3;
  pointer pNVar4;
  long in_RSI;
  _Node_iterator_base<Node<Tiles>,_true> in_RDI;
  iterator buffer_it;
  value_type *buffer;
  uint partition_value;
  unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  _Node_iterator_base<Node<Tiles>,_true> local_38;
  _Node_iterator_base<Node<Tiles>,_true> local_30;
  reference local_28;
  uint local_1c;
  long local_18;
  pair<bool,_bool> local_2;
  
  local_18 = in_RSI;
  local_1c = get_partition_value((CompressClosedList<Node<Tiles>_> *)in_RDI._M_cur,
                                 (Node<Tiles> *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_28 = std::
             vector<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
             ::operator[](&((CompressClosedList<Node<Tiles>_> *)in_RDI._M_cur)->buffers,
                          (ulong)local_1c);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x11b64e);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    *(size_t *)
     ((long)&in_RDI._M_cur[5].super__Hash_node_value<Node<Tiles>,_true>.
             super__Hash_node_value_base<Node<Tiles>_>._M_storage._M_storage + 8) =
         *(size_t *)
          ((long)&in_RDI._M_cur[5].super__Hash_node_value<Node<Tiles>,_true>.
                  super__Hash_node_value_base<Node<Tiles>_>._M_storage._M_storage + 8) + 1;
    if (((ulong)((in_RDI._M_cur)->super__Hash_node_base)._M_nxt & 1) != 0) {
      iVar3 = (int)*(char *)(local_18 + 1);
      pNVar4 = std::__detail::_Node_iterator<Node<Tiles>,_true,_true>::operator->
                         ((_Node_iterator<Node<Tiles>,_true,_true> *)0x11b6ad);
      if (iVar3 < pNVar4->g) {
        std::
        unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>
        ::erase((unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>
                 *)CONCAT44(iVar3,in_stack_ffffffffffffff90),(iterator)in_RDI._M_cur);
        std::
        unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>
        ::insert((unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffa7,
                             CONCAT16(in_stack_ffffffffffffffa6,
                                      CONCAT15(in_stack_ffffffffffffffa5,
                                               CONCAT14(in_stack_ffffffffffffffa4,
                                                        CONCAT13(in_stack_ffffffffffffffa3,
                                                                 CONCAT12(in_stack_ffffffffffffffa2,
                                                                          in_stack_ffffffffffffffa0)
                                                                ))))),(value_type *)in_RDI._M_cur);
        pVar2 = std::make_pair<bool,bool>((bool *)in_stack_ffffffffffffff88,(bool *)0x11b70b);
        return pVar2;
      }
    }
    local_2 = std::make_pair<bool,bool>((bool *)in_stack_ffffffffffffff88,(bool *)0x11b72d);
  }
  else {
    local_2 = std::make_pair<bool,bool>((bool *)in_stack_ffffffffffffff88,(bool *)0x11b74d);
  }
  return local_2;
}

Assistant:

pair<found, reopened> CompressClosedList<Entry>::
    find_in_buffers(const Entry &entry) {
        auto partition_value = get_partition_value(entry);
        
        auto& buffer = buffers[partition_value];
        
        auto buffer_it = buffer.find(entry);
        if (buffer_it != buffer.end()) {
            ++buffer_hits;
            if (reopen_closed) {
                if (entry.g < buffer_it->g) {
                    buffer.erase(buffer_it);
                    buffer.insert(entry);
                    return make_pair(true, true);
                }
            }
            return make_pair(true, false);
        }
        return make_pair(false, false);
    }